

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckFeatures.cpp
# Opt level: O0

void __thiscall GdlRenderer::CheckLanguageFeatureSize(GdlRenderer *this)

{
  bool bVar1;
  size_type_conflict sVar2;
  iterator pgdlobj;
  iterator staMsg;
  reference ppGVar3;
  size_t sVar4;
  GrcErrorList *this_00;
  __normal_iterator<GdlLanguageDefn_**,_std::vector<GdlLanguageDefn_*,_std::allocator<GdlLanguageDefn_*>_>_>
  *in_RDI;
  GdlLanguageDefn *plang;
  iterator __end1;
  iterator __begin1;
  vector<GdlLanguageDefn_*,_std::allocator<GdlLanguageDefn_*>_> *__range1;
  size_t cbSillSize;
  vector<GdlLanguageDefn_*,_std::allocator<GdlLanguageDefn_*>_> *in_stack_ffffffffffffff88;
  allocator *paVar5;
  allocator local_51;
  string local_50 [32];
  GdlLanguageDefn *local_30;
  __normal_iterator<GdlLanguageDefn_**,_std::vector<GdlLanguageDefn_*,_std::allocator<GdlLanguageDefn_*>_>_>
  *p_Var6;
  int nID;
  
  sVar2 = std::vector<GdlLanguageDefn_*,_std::allocator<GdlLanguageDefn_*>_>::size
                    ((vector<GdlLanguageDefn_*,_std::allocator<GdlLanguageDefn_*>_> *)(in_RDI + 0xe)
                    );
  this_00 = (GrcErrorList *)(sVar2 * 8 + 0x14);
  p_Var6 = in_RDI + 0xe;
  pgdlobj = std::vector<GdlLanguageDefn_*,_std::allocator<GdlLanguageDefn_*>_>::begin
                      (in_stack_ffffffffffffff88);
  staMsg = std::vector<GdlLanguageDefn_*,_std::allocator<GdlLanguageDefn_*>_>::end
                     (in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<GdlLanguageDefn_**,_std::vector<GdlLanguageDefn_*,_std::allocator<GdlLanguageDefn_*>_>_>
                               *)in_stack_ffffffffffffff88);
    nID = (int)((ulong)p_Var6 >> 0x20);
    if (!bVar1) break;
    ppGVar3 = __gnu_cxx::
              __normal_iterator<GdlLanguageDefn_**,_std::vector<GdlLanguageDefn_*,_std::allocator<GdlLanguageDefn_*>_>_>
              ::operator*((__normal_iterator<GdlLanguageDefn_**,_std::vector<GdlLanguageDefn_*,_std::allocator<GdlLanguageDefn_*>_>_>
                           *)&stack0xffffffffffffffe0);
    local_30 = *ppGVar3;
    sVar4 = GdlLanguageDefn::NumberOfSettings((GdlLanguageDefn *)0x1593c7);
    this_00 = (GrcErrorList *)(&this_00->m_fFatalError + sVar4 * 4);
    __gnu_cxx::
    __normal_iterator<GdlLanguageDefn_**,_std::vector<GdlLanguageDefn_*,_std::allocator<GdlLanguageDefn_*>_>_>
    ::operator++((__normal_iterator<GdlLanguageDefn_**,_std::vector<GdlLanguageDefn_*,_std::allocator<GdlLanguageDefn_*>_>_>
                  *)&stack0xffffffffffffffe0);
  }
  if ((GrcErrorList *)0xfffe < this_00) {
    paVar5 = &local_51;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_50,"Too many language-feature assignments to fit in Sill table",paVar5);
    GrcErrorList::AddError(this_00,nID,(GdlObject *)pgdlobj._M_current,(string *)staMsg._M_current);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  return;
}

Assistant:

void GdlRenderer::CheckLanguageFeatureSize()
{
	// 12 = table info, + 8 bytes per language
	size_t cbSillSize = 12 + (m_vplang.size() * 8);
	cbSillSize += 8; // bogus entry

	for (auto const plang: m_vplang)
		cbSillSize += plang->NumberOfSettings() * 4; // 4 bytes per feature setting

	if (cbSillSize >= 0x0000FFFF)
	{
		g_errorList.AddError(3157, NULL,
			"Too many language-feature assignments to fit in Sill table");
	}
}